

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transit.cpp
# Opt level: O0

int __thiscall
Vault::Transit::verify
          (Transit *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  Client *client;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  Url local_50;
  Parameters *local_30;
  Parameters *parameters_local;
  Algorithm *algorithm_local;
  Path *key_local;
  Transit *this_local;
  
  client = *(Client **)ctx;
  local_30 = (Parameters *)tbs;
  parameters_local = (Parameters *)siglen;
  algorithm_local = (Algorithm *)sig;
  key_local = (Path *)ctx;
  this_local = this;
  Vault::operator+(&local_d0,"verify/",
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)sig);
  std::operator+(&local_b0,&local_d0,"/");
  Vault::operator+(&local_90,&local_b0,
                   (Tiny<Vault::AlgorithmDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)parameters_local);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_70,&local_90);
  getUrl(&local_50,(Transit *)ctx,&local_70);
  HttpConsumer::post((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,client,&local_50,local_30);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_50);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return (int)this;
}

Assistant:

std::optional<std::string>
Vault::Transit::verify(const Path &key, const Algorithm &algorithm,
                       const Parameters &parameters) {
  return HttpConsumer::post(
      client_, getUrl(Path{"verify/" + key + "/" + algorithm}), parameters);
}